

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

uint8_t * __thiscall
google::protobuf::UninterpretedOption_NamePart::_InternalSerialize
          (UninterpretedOption_NamePart *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  uint uVar1;
  bool bVar2;
  int size;
  uint32_t *puVar3;
  char *data;
  string *s;
  uint8_t *target_00;
  UnknownFieldSet *unknown_fields;
  uint32_t cached_has_bits;
  EpsCopyOutputStream *stream_local;
  uint8_t *target_local;
  UninterpretedOption_NamePart *this_local;
  
  puVar3 = internal::HasBits<1UL>::operator[](&this->_has_bits_,0);
  uVar1 = *puVar3;
  stream_local = (EpsCopyOutputStream *)target;
  if ((uVar1 & 1) != 0) {
    _internal_name_part_abi_cxx11_(this);
    data = (char *)std::__cxx11::string::data();
    _internal_name_part_abi_cxx11_(this);
    size = std::__cxx11::string::length();
    internal::WireFormat::VerifyUTF8StringNamedField
              (data,size,SERIALIZE,"google.protobuf.UninterpretedOption.NamePart.name_part");
    s = _internal_name_part_abi_cxx11_(this);
    stream_local = (EpsCopyOutputStream *)
                   io::EpsCopyOutputStream::WriteStringMaybeAliased(stream,1,s,target);
  }
  if ((uVar1 & 2) != 0) {
    target_00 = io::EpsCopyOutputStream::EnsureSpace(stream,(uint8_t *)stream_local);
    bVar2 = _internal_is_extension(this);
    stream_local = (EpsCopyOutputStream *)
                   internal::WireFormatLite::WriteBoolToArray(2,bVar2,target_00);
  }
  bVar2 = internal::InternalMetadata::have_unknown_fields
                    (&(this->super_Message).super_MessageLite._internal_metadata_);
  if (bVar2) {
    unknown_fields =
         internal::InternalMetadata::unknown_fields<google::protobuf::UnknownFieldSet>
                   (&(this->super_Message).super_MessageLite._internal_metadata_,
                    UnknownFieldSet::default_instance);
    stream_local = (EpsCopyOutputStream *)
                   internal::WireFormat::InternalSerializeUnknownFieldsToArray
                             (unknown_fields,(uint8_t *)stream_local,stream);
  }
  return (uint8_t *)stream_local;
}

Assistant:

uint8_t* UninterpretedOption_NamePart::_InternalSerialize(
    uint8_t* target, ::PROTOBUF_NAMESPACE_ID::io::EpsCopyOutputStream* stream) const {
  // @@protoc_insertion_point(serialize_to_array_start:google.protobuf.UninterpretedOption.NamePart)
  uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = _has_bits_[0];
  // required string name_part = 1;
  if (cached_has_bits & 0x00000001u) {
    ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::VerifyUTF8StringNamedField(
      this->_internal_name_part().data(), static_cast<int>(this->_internal_name_part().length()),
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::SERIALIZE,
      "google.protobuf.UninterpretedOption.NamePart.name_part");
    target = stream->WriteStringMaybeAliased(
        1, this->_internal_name_part(), target);
  }

  // required bool is_extension = 2;
  if (cached_has_bits & 0x00000002u) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteBoolToArray(2, this->_internal_is_extension(), target);
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::InternalSerializeUnknownFieldsToArray(
        _internal_metadata_.unknown_fields<::PROTOBUF_NAMESPACE_ID::UnknownFieldSet>(::PROTOBUF_NAMESPACE_ID::UnknownFieldSet::default_instance), target, stream);
  }
  // @@protoc_insertion_point(serialize_to_array_end:google.protobuf.UninterpretedOption.NamePart)
  return target;
}